

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
BlockSizes(TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this,TPZVec<int> *blocksizes)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZAdmChunkVector<TPZConnect,_10> *this_00;
  int64_t iVar3;
  TPZConnect *this_01;
  int64_t iVar4;
  int *piVar5;
  TPZVec<int> *in_RSI;
  TPZCompMesh *in_RDI;
  int64_t numactiv;
  int64_t blpos;
  TPZConnect *con_1;
  int64_t blsize;
  int64_t bl;
  TPZConnect *con;
  int64_t c;
  int64_t nc;
  TPZAdmChunkVector<TPZConnect,_10> *connectvec;
  int nblocks;
  TPZSubCompMesh *mesh;
  TPZSubCompMesh *in_stack_00000170;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  int in_stack_ffffffffffffff8c;
  TPZChunkVector<TPZConnect,_10> *in_stack_ffffffffffffff98;
  TPZEquationFilter *in_stack_ffffffffffffffa8;
  TPZChunkVector<TPZConnect,_10> *in_stack_ffffffffffffffb0;
  long local_38;
  int local_1c;
  
  iVar2 = (*(in_RDI->fReference->super_TPZSavable)._vptr_TPZSavable[0x13])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    TPZSubCompMesh::PermuteExternalConnects(in_stack_00000170);
  }
  local_1c = 0;
  this_00 = TPZCompMesh::ConnectVec((TPZCompMesh *)in_RDI->fReference);
  iVar3 = TPZChunkVector<TPZConnect,_10>::NElements(&this_00->super_TPZChunkVector<TPZConnect,_10>);
  for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
    this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                        (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
    iVar2 = TPZConnect::HasDependency(this_01);
    if (((iVar2 == 0) && (bVar1 = TPZConnect::IsCondensed(this_01), !bVar1)) &&
       (iVar4 = TPZConnect::SequenceNumber(this_01), -1 < iVar4)) {
      local_1c = local_1c + 1;
    }
  }
  (*in_RSI->_vptr_TPZVec[3])(in_RSI,(long)local_1c);
  for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
    in_stack_ffffffffffffffa8 =
         (TPZEquationFilter *)
         TPZChunkVector<TPZConnect,_10>::operator[]
                   (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
    iVar2 = TPZConnect::HasDependency((TPZConnect *)in_stack_ffffffffffffffa8);
    if (((iVar2 == 0) &&
        (bVar1 = TPZConnect::IsCondensed((TPZConnect *)in_stack_ffffffffffffffa8), !bVar1)) &&
       (iVar4 = TPZConnect::SequenceNumber((TPZConnect *)in_stack_ffffffffffffffa8), -1 < iVar4)) {
      iVar4 = TPZConnect::SequenceNumber((TPZConnect *)in_stack_ffffffffffffffa8);
      iVar2 = TPZConnect::NDof((TPZConnect *)in_stack_ffffffffffffff98,in_RDI);
      in_stack_ffffffffffffffb0 = (TPZChunkVector<TPZConnect,_10> *)(long)iVar2;
      TPZCompMesh::Block((TPZCompMesh *)in_RDI->fReference);
      iVar2 = TPZBlock::Position((TPZBlock *)in_RDI,in_stack_ffffffffffffff8c);
      in_stack_ffffffffffffff98 =
           (TPZChunkVector<TPZConnect,_10> *)
           TPZEquationFilter::NumActive
                     (in_stack_ffffffffffffffa8,(long)iVar2,(int64_t)in_stack_ffffffffffffff98);
      if ((in_stack_ffffffffffffff98 != (TPZChunkVector<TPZConnect,_10> *)0x0) &&
         (in_stack_ffffffffffffff98 != in_stack_ffffffffffffffb0)) {
        pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
      }
      if (in_stack_ffffffffffffff98 == (TPZChunkVector<TPZConnect,_10> *)0x0) {
        piVar5 = TPZVec<int>::operator[](in_RSI,iVar4);
        *piVar5 = 0;
      }
      else {
        in_stack_ffffffffffffff8c = (int)in_stack_ffffffffffffffb0;
        piVar5 = TPZVec<int>::operator[](in_RSI,iVar4);
        *piVar5 = in_stack_ffffffffffffff8c;
      }
    }
  }
  return;
}

Assistant:

void TPZBlockDiagonalStructMatrix<TVar,TPar>::BlockSizes(TPZVec < int > & blocksizes){
    
    if(this->fMesh->FatherMesh() != 0) {
        TPZSubCompMesh *mesh = (TPZSubCompMesh *) this->fMesh;
        mesh->PermuteExternalConnects();
    }
    int nblocks = 0;
    TPZAdmChunkVector<TPZConnect> &connectvec = this->fMesh->ConnectVec();
    int64_t nc = connectvec.NElements();
    int64_t c;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        nblocks++;
    }
    blocksizes.Resize(nblocks);
    int64_t bl,blsize;
    for(c=0; c<nc; c++) {
        TPZConnect &con = connectvec[c];
        if(con.HasDependency() || con.IsCondensed() || con.SequenceNumber() < 0) continue;
        bl = con.SequenceNumber();
        blsize = con.NDof(*this->fMesh);
        int64_t blpos = this->fMesh->Block().Position(bl);
        int64_t numactiv = this->fEquationFilter.NumActive(blpos, blpos+blsize);
        if (numactiv && numactiv != blsize) {
            DebugStop();
        }
        if(!numactiv)
        {
            blocksizes[bl] = 0;
        }
        else
        {
            blocksizes[bl] = blsize;
        }
    }
}